

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::DistanceFinder::find
          (SelectionSet *__return_storage_ptr__,DistanceFinder *this,SelectionSet *bs,
          RealType distance)

{
  Snapshot *this_00;
  pointer ppSVar1;
  RigidBody *this_01;
  pointer ppMVar2;
  Molecule *this_02;
  StuntDouble *this_03;
  pointer ppBVar3;
  Bond *pBVar4;
  pointer ppBVar5;
  Bend *pBVar6;
  pointer ppTVar7;
  Torsion *pTVar8;
  pointer ppIVar9;
  Inversion *pIVar10;
  bool bVar11;
  size_t j;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  double dVar15;
  Vector3d centerPos;
  SelectionSet bsTemp;
  Vector3d r;
  Vector3d r_2;
  Vector<double,_3U> local_c0;
  SelectionSet local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  SelectionSet local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_c0);
  this_00 = this->info_->sman_->currentSnapshot_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_90,&this->nObjects_);
  SelectionSet::SelectionSet(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_90);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  uVar14 = 0;
  while( true ) {
    ppSVar1 = (this->stuntdoubles_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stuntdoubles_).
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <=
        (ulong)uVar14) break;
    this_01 = (RigidBody *)ppSVar1[uVar14];
    if ((this_01 != (RigidBody *)0x0) && ((this_01->super_StuntDouble).objType_ == otRigidBody)) {
      RigidBody::updateAtoms(this_01);
    }
    uVar14 = uVar14 + 1;
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&local_a8.bitsets_,&bs->bitsets_);
  SelectionSet::parallelReduce(&local_78,&local_a8);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&local_a8.bitsets_);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_78.bitsets_);
  for (uVar13 = 0;
      uVar13 < (ulong)((local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_offset +
               ((long)((local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_finish.super__Bit_iterator_base._M_p -
               (long)((local_a8.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p) * 8; uVar13 = uVar13 + 1) {
    bVar11 = OpenMDBitSet::operator[]
                       (local_a8.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start,(int)uVar13);
    if (bVar11) {
      StuntDouble::getPos((Vector3d *)&local_78,
                          (this->stuntdoubles_).
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13]);
      Vector<double,_3U>::operator=(&local_c0,(Vector<double,_3U> *)&local_78);
      for (uVar12 = 0;
          ppMVar2 = (this->molecules_).
                    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->molecules_).
                                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3);
          uVar12 = uVar12 + 1) {
        this_02 = ppMVar2[uVar12];
        if (this_02 != (Molecule *)0x0) {
          Molecule::getCom((Vector3d *)&local_60,this_02);
          operator-(&local_48,&local_c0,&local_60);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,&local_48);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_78);
          dVar15 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_78);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 5,uVar12);
          }
        }
      }
      for (uVar12 = 0;
          ppSVar1 = (this->stuntdoubles_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->stuntdoubles_).
                                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
          uVar12 = uVar12 + 1) {
        this_03 = ppSVar1[uVar12];
        if (this_03 != (StuntDouble *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_60,this_03);
          operator-(&local_48,&local_c0,&local_60);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_78,&local_48);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_78);
          dVar15 = Vector<double,_3U>::length((Vector<double,_3U> *)&local_78);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start,uVar12);
          }
        }
      }
      for (uVar12 = 0;
          ppBVar3 = (this->bonds_).
                    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->bonds_).
                                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar3 >> 3);
          uVar12 = uVar12 + 1) {
        pBVar4 = ppBVar3[uVar12];
        if (pBVar4 != (Bond *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pBVar4->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bonds_).
                                           super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,2.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_48);
          dVar15 = Vector<double,_3U>::length(&local_48);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,uVar12);
          }
        }
      }
      for (uVar12 = 0;
          ppBVar5 = (this->bends_).
                    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->bends_).
                                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar5 >> 3);
          uVar12 = uVar12 + 1) {
        pBVar6 = ppBVar5[uVar12];
        if (pBVar6 != (Bend *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pBVar6->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bends_).
                                           super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->bends_).
                                           super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,3.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_48);
          dVar15 = Vector<double,_3U>::length(&local_48);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2,uVar12);
          }
        }
      }
      for (uVar12 = 0;
          ppTVar7 = (this->torsions_).
                    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->torsions_).
                                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >> 3);
          uVar12 = uVar12 + 1) {
        pTVar8 = ppTVar7[uVar12];
        if (pTVar8 != (Torsion *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pTVar8->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->torsions_).
                                           super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x18));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,4.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_48);
          dVar15 = Vector<double,_3U>::length(&local_48);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3,uVar12);
          }
        }
      }
      for (uVar12 = 0;
          ppIVar9 = (this->inversions_).
                    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          uVar12 < (ulong)((long)(this->inversions_).
                                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar9 >> 3);
          uVar12 = uVar12 + 1) {
        pIVar10 = ppIVar9[uVar12];
        if (pIVar10 != (Inversion *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_78,
                              (StuntDouble *)
                              *(pIVar10->super_ShortRangeInteraction).atoms_.
                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 8));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x10));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          StuntDouble::getPos((Vector3d *)&local_48,
                              *(StuntDouble **)
                               (*(long *)&((this->inversions_).
                                           super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar12]->
                                          super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data + 0x18));
          Vector<double,_3U>::add((Vector<double,_3U> *)&local_78,&local_48);
          operator/(&local_48,(Vector<double,_3U> *)&local_78,4.0);
          Vector3<double>::operator=((Vector3<double> *)&local_78,&local_48);
          operator-(&local_60,&local_c0,(Vector<double,_3U> *)&local_78);
          Vector<double,_3U>::Vector(&local_48,&local_60);
          Snapshot::wrapVector(this_00,(Vector3d *)&local_48);
          dVar15 = Vector<double,_3U>::length(&local_48);
          if (dVar15 <= distance) {
            OpenMDBitSet::setBitOn
                      ((__return_storage_ptr__->bitsets_).
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4,uVar12);
          }
        }
      }
    }
  }
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_a8.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet DistanceFinder::find(const SelectionSet& bs, RealType distance) {
    StuntDouble* center;
    Vector3d centerPos;
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SelectionSet bsResult(nObjects_);
    assert(bsResult.size() == bs.size());

#ifdef IS_MPI
    int mol;
    int proc;
    RealType data[3];
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
#endif

    for (unsigned int j = 0; j < stuntdoubles_.size(); ++j) {
      if (stuntdoubles_[j] != NULL) {
        if (stuntdoubles_[j]->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(stuntdoubles_[j]);
          rb->updateAtoms();
        }
      }
    }

    SelectionSet bsTemp = bs;
    bsTemp              = bsTemp.parallelReduce();

    for (size_t i = 0; i < bsTemp.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (bsTemp.bitsets_[STUNTDOUBLE][i]) {
#ifdef IS_MPI

        // Now, if we own stuntdouble i, we can use the position, but in
        // parallel, we'll need to let everyone else know what that
        // position is!

        mol  = info_->getGlobalMolMembership(i);
        proc = info_->getMolToProc(mol);

        if (proc == worldRank) {
          center    = stuntdoubles_[i];
          centerPos = center->getPos();
          data[0]   = centerPos.x();
          data[1]   = centerPos.y();
          data[2]   = centerPos.z();
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
        } else {
          MPI_Bcast(data, 3, MPI_REALTYPE, proc, MPI_COMM_WORLD);
          centerPos = Vector3d(data);
        }
#else
        center    = stuntdoubles_[i];
        centerPos = center->getPos();
#endif
        for (size_t j = 0; j < molecules_.size(); ++j) {
          if (molecules_[j] != NULL) {
            Vector3d r = centerPos - molecules_[j]->getCom();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[MOLECULE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < stuntdoubles_.size(); ++j) {
          if (stuntdoubles_[j] != NULL) {
            Vector3d r = centerPos - stuntdoubles_[j]->getPos();
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[STUNTDOUBLE].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < bonds_.size(); ++j) {
          if (bonds_[j] != NULL) {
            Vector3d loc = bonds_[j]->getAtomA()->getPos();
            loc += bonds_[j]->getAtomB()->getPos();
            loc        = loc / 2.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BOND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < bends_.size(); ++j) {
          if (bends_[j] != NULL) {
            Vector3d loc = bends_[j]->getAtomA()->getPos();
            loc += bends_[j]->getAtomB()->getPos();
            loc += bends_[j]->getAtomC()->getPos();
            loc        = loc / 3.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) { bsResult.bitsets_[BEND].setBitOn(j); }
          }
        }
        for (size_t j = 0; j < torsions_.size(); ++j) {
          if (torsions_[j] != NULL) {
            Vector3d loc = torsions_[j]->getAtomA()->getPos();
            loc += torsions_[j]->getAtomB()->getPos();
            loc += torsions_[j]->getAtomC()->getPos();
            loc += torsions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[TORSION].setBitOn(j);
            }
          }
        }
        for (size_t j = 0; j < inversions_.size(); ++j) {
          if (inversions_[j] != NULL) {
            Vector3d loc = inversions_[j]->getAtomA()->getPos();
            loc += inversions_[j]->getAtomB()->getPos();
            loc += inversions_[j]->getAtomC()->getPos();
            loc += inversions_[j]->getAtomD()->getPos();
            loc        = loc / 4.0;
            Vector3d r = centerPos - loc;
            currSnapshot->wrapVector(r);
            if (r.length() <= distance) {
              bsResult.bitsets_[INVERSION].setBitOn(j);
            }
          }
        }
      }
    }
    return bsResult;
  }